

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3GetMatchinfo(sqlite3_context *pCtx,Fts3Cursor *pCsr,char *zArg)

{
  int iVar1;
  size_t sVar2;
  MatchinfoBuffer *pMVar3;
  char *pcStack_80;
  int n;
  char *zErr;
  size_t sStack_70;
  int i;
  size_t nMatchinfo;
  _func_void_void_ptr *xDestroyOut;
  u32 *aOut;
  int bGlobal;
  int rc;
  Fts3Table *pTab;
  MatchInfo sInfo;
  char *zArg_local;
  Fts3Cursor *pCsr_local;
  sqlite3_context *pCtx_local;
  
  _bGlobal = (Fts3Table *)(pCsr->base).pVtab;
  aOut._4_4_ = 0;
  aOut._0_4_ = 0;
  xDestroyOut = (_func_void_void_ptr *)0x0;
  nMatchinfo = 0;
  sInfo.aMatchinfo = (u32 *)zArg;
  memset(&pTab,0,0x28);
  sInfo.pCursor._0_4_ = _bGlobal->nColumn;
  pTab = (Fts3Table *)pCsr;
  if ((pCsr->pMIBuffer != (MatchinfoBuffer *)0x0) &&
     (iVar1 = strcmp(pCsr->pMIBuffer->zMatchinfo,(char *)sInfo.aMatchinfo), iVar1 != 0)) {
    sqlite3Fts3MIBufferFree(pCsr->pMIBuffer);
    pCsr->pMIBuffer = (MatchinfoBuffer *)0x0;
  }
  if (pCsr->pMIBuffer == (MatchinfoBuffer *)0x0) {
    sStack_70 = 0;
    iVar1 = fts3ExprPhraseCount(pCsr->pExpr);
    pCsr->nPhrase = iVar1;
    sInfo.pCursor._4_4_ = pCsr->nPhrase;
    for (zErr._4_4_ = 0; *(char *)((long)sInfo.aMatchinfo + (long)zErr._4_4_) != '\0';
        zErr._4_4_ = zErr._4_4_ + 1) {
      pcStack_80 = (char *)0x0;
      iVar1 = fts3MatchinfoCheck(_bGlobal,*(char *)((long)sInfo.aMatchinfo + (long)zErr._4_4_),
                                 &stack0xffffffffffffff80);
      if (iVar1 != 0) {
        sqlite3_result_error(pCtx,pcStack_80,-1);
        sqlite3_free(pcStack_80);
        return;
      }
      sVar2 = fts3MatchinfoSize((MatchInfo *)&pTab,
                                *(char *)((long)sInfo.aMatchinfo + (long)zErr._4_4_));
      sStack_70 = sVar2 + sStack_70;
    }
    pMVar3 = fts3MIBufferNew(sStack_70,(char *)sInfo.aMatchinfo);
    pCsr->pMIBuffer = pMVar3;
    if (pCsr->pMIBuffer == (MatchinfoBuffer *)0x0) {
      aOut._4_4_ = 7;
    }
    pCsr->isMatchinfoNeeded = 1;
    aOut._0_4_ = 1;
  }
  if ((aOut._4_4_ == 0) &&
     (nMatchinfo = (size_t)fts3MIBufferAlloc(pCsr->pMIBuffer,(u32 **)&xDestroyOut),
     (_func_void_void_ptr *)nMatchinfo == (_func_void_void_ptr *)0x0)) {
    aOut._4_4_ = 7;
  }
  if (aOut._4_4_ == 0) {
    sInfo._24_8_ = xDestroyOut;
    sInfo.pCursor._4_4_ = pCsr->nPhrase;
    aOut._4_4_ = fts3MatchinfoValues(pCsr,(int)aOut,(MatchInfo *)&pTab,(char *)sInfo.aMatchinfo);
    if ((int)aOut != 0) {
      fts3MIBufferSetGlobal(pCsr->pMIBuffer);
    }
  }
  if (aOut._4_4_ == 0) {
    sqlite3_result_blob(pCtx,xDestroyOut,pCsr->pMIBuffer->nElem << 2,
                        (_func_void_void_ptr *)nMatchinfo);
  }
  else {
    sqlite3_result_error_code(pCtx,aOut._4_4_);
    if (nMatchinfo != 0) {
      (*(code *)nMatchinfo)(xDestroyOut);
    }
  }
  return;
}

Assistant:

static void fts3GetMatchinfo(
  sqlite3_context *pCtx,        /* Return results here */
  Fts3Cursor *pCsr,               /* FTS3 Cursor object */
  const char *zArg                /* Second argument to matchinfo() function */
){
  MatchInfo sInfo;
  Fts3Table *pTab = (Fts3Table *)pCsr->base.pVtab;
  int rc = SQLITE_OK;
  int bGlobal = 0;                /* Collect 'global' stats as well as local */

  u32 *aOut = 0;
  void (*xDestroyOut)(void*) = 0;

  memset(&sInfo, 0, sizeof(MatchInfo));
  sInfo.pCursor = pCsr;
  sInfo.nCol = pTab->nColumn;

  /* If there is cached matchinfo() data, but the format string for the 
  ** cache does not match the format string for this request, discard 
  ** the cached data. */
  if( pCsr->pMIBuffer && strcmp(pCsr->pMIBuffer->zMatchinfo, zArg) ){
    sqlite3Fts3MIBufferFree(pCsr->pMIBuffer);
    pCsr->pMIBuffer = 0;
  }

  /* If Fts3Cursor.pMIBuffer is NULL, then this is the first time the
  ** matchinfo function has been called for this query. In this case 
  ** allocate the array used to accumulate the matchinfo data and
  ** initialize those elements that are constant for every row.
  */
  if( pCsr->pMIBuffer==0 ){
    size_t nMatchinfo = 0;        /* Number of u32 elements in match-info */
    int i;                        /* Used to iterate through zArg */

    /* Determine the number of phrases in the query */
    pCsr->nPhrase = fts3ExprPhraseCount(pCsr->pExpr);
    sInfo.nPhrase = pCsr->nPhrase;

    /* Determine the number of integers in the buffer returned by this call. */
    for(i=0; zArg[i]; i++){
      char *zErr = 0;
      if( fts3MatchinfoCheck(pTab, zArg[i], &zErr) ){
        sqlite3_result_error(pCtx, zErr, -1);
        sqlite3_free(zErr);
        return;
      }
      nMatchinfo += fts3MatchinfoSize(&sInfo, zArg[i]);
    }

    /* Allocate space for Fts3Cursor.aMatchinfo[] and Fts3Cursor.zMatchinfo. */
    pCsr->pMIBuffer = fts3MIBufferNew(nMatchinfo, zArg);
    if( !pCsr->pMIBuffer ) rc = SQLITE_NOMEM;

    pCsr->isMatchinfoNeeded = 1;
    bGlobal = 1;
  }

  if( rc==SQLITE_OK ){
    xDestroyOut = fts3MIBufferAlloc(pCsr->pMIBuffer, &aOut);
    if( xDestroyOut==0 ){
      rc = SQLITE_NOMEM;
    }
  }

  if( rc==SQLITE_OK ){
    sInfo.aMatchinfo = aOut;
    sInfo.nPhrase = pCsr->nPhrase;
    rc = fts3MatchinfoValues(pCsr, bGlobal, &sInfo, zArg);
    if( bGlobal ){
      fts3MIBufferSetGlobal(pCsr->pMIBuffer);
    }
  }

  if( rc!=SQLITE_OK ){
    sqlite3_result_error_code(pCtx, rc);
    if( xDestroyOut ) xDestroyOut(aOut);
  }else{
    int n = pCsr->pMIBuffer->nElem * sizeof(u32);
    sqlite3_result_blob(pCtx, aOut, n, xDestroyOut);
  }
}